

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  Expr *pEVar1;
  ModuleField *pMVar2;
  ModuleField *pMVar3;
  size_t *psVar4;
  bool bVar5;
  Result RVar6;
  _Head_base<0UL,_wabt::Import_*,_false> _Var7;
  Expr *pEVar8;
  _func_int **pp_Var9;
  ulong uVar10;
  ExprList *pEVar11;
  Enum EVar12;
  Location loc;
  string name;
  _Head_base<0UL,_wabt::Import_*,_false> local_120;
  Location local_118;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_f8;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_f0;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_e8;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_e0;
  undefined1 local_d8 [32];
  Location local_b8;
  ModuleFieldList local_98;
  Var local_78;
  
  RVar6 = Expect(this,Lpar);
  if (RVar6.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&local_78,this);
  local_118.field_1.field_1.offset = local_78.loc.field_1.field_1.offset;
  local_118.field_1._8_8_ = local_78.loc.field_1._8_8_;
  local_118.filename.data_ = local_78.loc.filename.data_;
  local_118.filename.size_ = local_78.loc.filename.size_;
  RVar6 = Expect(this,Memory);
  if (RVar6.enum_ == Error) {
    return (Result)Error;
  }
  local_d8._8_8_ = 0;
  local_d8[0x10] = '\0';
  local_d8._0_8_ = (Import *)(local_d8 + 0x10);
  ParseBindVarOpt(this,(string *)local_d8);
  local_98.size_ = 0;
  local_98.first_ = (ModuleField *)0x0;
  local_98.last_ = (ModuleField *)0x0;
  RVar6 = ParseInlineExports(this,&local_98,Memory);
  EVar12 = Error;
  pMVar3 = local_98.first_;
  if (RVar6.enum_ == Error) goto joined_r0x0022addb;
  bVar5 = PeekMatchLpar(this,Import);
  if (bVar5) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::MemoryImport,std::__cxx11::string&>
              ((wabt *)&local_120,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    RVar6 = ParseInlineImport(this,local_120._M_head_impl);
    if ((RVar6.enum_ != Error) &&
       (RVar6 = ParseLimits(this,(Limits *)
                                 &(((DataSegment *)((long)local_120._M_head_impl + 0x40))->
                                  memory_var).loc.filename.size_), RVar6.enum_ != Error)) {
      GetToken((Token *)&local_78,this);
      local_b8.field_1.field_0.line = local_78.loc.field_1._0_4_;
      local_b8.field_1.field_0.first_column = local_78.loc.field_1._4_4_;
      local_b8.field_1.field_0.last_column = (int)local_78.loc.field_1._8_8_;
      local_b8.field_1._12_4_ = (undefined4)((ulong)local_78.loc.field_1._8_8_ >> 0x20);
      local_b8.filename.data_ = local_78.loc.filename.data_;
      local_b8.filename.size_._0_4_ = (undefined4)local_78.loc.filename.size_;
      local_b8.filename.size_._4_4_ = (undefined4)(local_78.loc.filename.size_ >> 0x20);
      local_e0._M_head_impl = (ImportModuleField *)operator_new(0x48);
      _Var7._M_head_impl = local_120._M_head_impl;
      local_120._M_head_impl = (Import *)0x0;
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.filename.data_ = local_b8.filename.data_;
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.filename.size_ =
           CONCAT44(local_b8.filename.size_._4_4_,(undefined4)local_b8.filename.size_);
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.field_1.field_1.offset =
           CONCAT44(local_b8.field_1.field_0.first_column,local_b8.field_1.field_0.line);
      *(ulong *)((long)&((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                        super_ModuleField.loc.field_1 + 8) =
           CONCAT44(local_b8.field_1._12_4_,local_b8.field_1.field_0.last_column);
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      type_ = Import;
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      _vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_002c6ae0;
      ((local_e0._M_head_impl)->import)._M_t.
      super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
      super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = _Var7._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_e0);
      if (local_e0._M_head_impl != (ImportModuleField *)0x0) {
        (*((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_e0._M_head_impl = (ImportModuleField *)0x0;
      _Var7._M_head_impl = local_120._M_head_impl;
LAB_0022ad8b:
      if ((DataSegmentModuleField *)_Var7._M_head_impl != (DataSegmentModuleField *)0x0) {
        (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
           &((DataSegmentModuleField *)_Var7._M_head_impl)->
            super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField)._vptr_ModuleField
          [1])();
      }
LAB_0022ad96:
      anon_unknown_1::AppendInlineExportFields
                (module,&local_98,
                 (int)((ulong)((long)(module->memories).
                                     super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(module->memories).
                                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
      RVar6 = Expect(this,Rpar);
      EVar12 = (Enum)(RVar6.enum_ == Error);
      pMVar3 = local_98.first_;
      goto joined_r0x0022addb;
    }
    pMVar3 = local_98.first_;
    if ((DataSegmentModuleField *)local_120._M_head_impl == (DataSegmentModuleField *)0x0)
    goto joined_r0x0022addb;
    pp_Var9 = (((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
               &(local_120._M_head_impl)->_vptr_Import)->super_ModuleField)._vptr_ModuleField;
    _Var7._M_head_impl = local_120._M_head_impl;
  }
  else {
    bVar5 = MatchLpar(this,Data);
    if (bVar5) {
      _Var7._M_head_impl = (Import *)operator_new(0xe0);
      (((string *)
       &(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
         &((DataSegmentModuleField *)_Var7._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).
        super_intrusive_list_base<wabt::ModuleField>)->_M_dataplus)._M_p = (pointer)0x0;
      ((string *)
      &(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
        &((DataSegmentModuleField *)_Var7._M_head_impl)->
         super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).
       super_intrusive_list_base<wabt::ModuleField>)->_M_string_length = 0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
            &((DataSegmentModuleField *)_Var7._M_head_impl)->
             super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).loc)->
      _M_allocated_capacity = (size_type)local_118.filename.data_;
      *(size_type *)
       ((long)&(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
                &((DataSegmentModuleField *)_Var7._M_head_impl)->
                 super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).loc + 8) =
           local_118.filename.size_;
      *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
              &((DataSegmentModuleField *)_Var7._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).loc)->
        _M_local_buf + 0x10) = local_118.field_1.field_1.offset;
      *(undefined8 *)
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
              &((DataSegmentModuleField *)_Var7._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).loc)->
        _M_local_buf + 0x18) = local_118.field_1._8_8_;
      *(undefined4 *)
       &(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
         &((DataSegmentModuleField *)_Var7._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).type_ = 8;
      (((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
       &((DataSegmentModuleField *)_Var7._M_head_impl)->
        super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField)._vptr_ModuleField =
           (_func_int **)&PTR__DataSegmentModuleField_002c6920;
      DataSegment::DataSegment
                (&((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment,
                 (string_view)ZEXT816(0));
      local_b8.field_1.field_0.line = 0;
      local_b8.field_1.field_0.first_column = 0;
      local_b8.field_1.field_0.last_column = 0;
      local_b8.filename.data_ = (char *)0x0;
      local_b8.filename.size_._0_4_ = 0;
      local_b8.filename.size_._4_4_ = 0;
      Var::Var(&local_78,
               (Index)((ulong)((long)(module->memories).
                                     super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(module->memories).
                                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3),&local_b8);
      Var::operator=(&(((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment).memory_var,
                     &local_78);
      Var::~Var(&local_78);
      pEVar8 = (Expr *)operator_new(0x88);
      (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      (pEVar8->loc).filename.data_ = (char *)0x0;
      (pEVar8->loc).filename.size_ = 0;
      *(undefined8 *)((long)&(pEVar8->loc).filename.size_ + 4) = 0;
      *(undefined8 *)((long)&(pEVar8->loc).field_1.field_1.offset + 4) = 0;
      pEVar8->type_ = Const;
      pEVar8->_vptr_Expr = (_func_int **)&PTR__Expr_002c66e0;
      pEVar8[1]._vptr_Expr = (_func_int **)0x0;
      pEVar8[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      *(undefined8 *)((long)&pEVar8[1].super_intrusive_list_base<wabt::Expr>.next_ + 4) = 0;
      *(undefined8 *)((long)&pEVar8[1].super_intrusive_list_base<wabt::Expr>.prev_ + 4) = 0;
      *(undefined4 *)&pEVar8[1].loc.filename.size_ = 0xffffffff;
      pEVar8[1].loc.field_1.field_0.line = 0;
      pEVar8[1].type_ = AtomicLoad;
      pEVar1 = (((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment).offset.last_;
      if (pEVar1 == (Expr *)0x0) {
        pEVar11 = &(((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment).offset;
      }
      else {
        (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
        pEVar11 = (ExprList *)&pEVar1->super_intrusive_list_base<wabt::Expr>;
      }
      pEVar11->first_ = pEVar8;
      (((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment).offset.last_ = pEVar8;
      psVar4 = &(((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment).offset.size_;
      *psVar4 = *psVar4 + 1;
      if (*psVar4 == 0) {
        __assert_fail("!empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                      ,0x192,
                      "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                     );
      }
      (pEVar8->loc).field_1.field_1.offset = (size_t)local_118.field_1.field_1.offset;
      *(undefined8 *)((long)&(pEVar8->loc).field_1 + 8) = local_118.field_1._8_8_;
      (pEVar8->loc).filename.data_ = local_118.filename.data_;
      (pEVar8->loc).filename.size_ = local_118.filename.size_;
      ParseTextListOpt(this,&(((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment).data);
      RVar6 = Expect(this,Rpar);
      if (RVar6.enum_ != Error) {
        MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
                  ((wabt *)&local_78,&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
        uVar10 = (ulong)((*(int *)&(((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment).
                                   data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&(((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment).
                                  data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) + 0xffffU >> 0x10);
        *(ulong *)((long)&(((DataSegment *)((long)local_78.loc.filename.data_ + 0x40))->name).
                          field_2 + 8) = uVar10;
        (((DataSegment *)((long)local_78.loc.filename.data_ + 0x40))->memory_var).loc.filename.data_
             = (char *)uVar10;
        *(bool *)&(((DataSegment *)((long)local_78.loc.filename.data_ + 0x40))->memory_var).loc.
                  filename.size_ = true;
        local_e8._M_head_impl = (MemoryModuleField *)local_78.loc.filename.data_;
        local_78.loc.filename.data_ = (char *)0x0;
        Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                    *)&local_e8);
        if (local_e8._M_head_impl != (MemoryModuleField *)0x0) {
          (*((local_e8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
            super_ModuleField._vptr_ModuleField[1])();
        }
        local_e8._M_head_impl = (MemoryModuleField *)0x0;
        local_f0._M_head_impl = (DataSegmentModuleField *)_Var7._M_head_impl;
        Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                    *)&local_f0);
        if (local_f0._M_head_impl != (DataSegmentModuleField *)0x0) {
          (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
             &(local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->
            super_ModuleField)._vptr_ModuleField[1])();
        }
        local_f0._M_head_impl = (DataSegmentModuleField *)0x0;
        _Var7._M_head_impl = (Import *)local_78.loc.filename.data_;
        goto LAB_0022ad8b;
      }
    }
    else {
      _Var7._M_head_impl = (Import *)operator_new(0x78);
      (((string *)
       &(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
         &((DataSegmentModuleField *)_Var7._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).
        super_intrusive_list_base<wabt::ModuleField>)->_M_dataplus)._M_p = (pointer)0x0;
      ((string *)
      &(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
        &((DataSegmentModuleField *)_Var7._M_head_impl)->
         super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).
       super_intrusive_list_base<wabt::ModuleField>)->_M_string_length = 0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
            &((DataSegmentModuleField *)_Var7._M_head_impl)->
             super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).loc)->
      _M_allocated_capacity = (size_type)local_118.filename.data_;
      *(size_type *)
       ((long)&(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
                &((DataSegmentModuleField *)_Var7._M_head_impl)->
                 super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).loc + 8) =
           local_118.filename.size_;
      *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
              &((DataSegmentModuleField *)_Var7._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).loc)->
        _M_local_buf + 0x10) = local_118.field_1.field_1.offset;
      *(undefined8 *)
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
              &((DataSegmentModuleField *)_Var7._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).loc)->
        _M_local_buf + 0x18) = local_118.field_1._8_8_;
      *(undefined4 *)
       &(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
         &((DataSegmentModuleField *)_Var7._M_head_impl)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).type_ = 7;
      (((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
       &((DataSegmentModuleField *)_Var7._M_head_impl)->
        super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField)._vptr_ModuleField =
           (_func_int **)&PTR__MemoryModuleField_002c6d80;
      local_78.loc.filename.data_ = (char *)local_d8._0_8_;
      local_78.loc.filename.size_ = local_d8._8_8_;
      string_view::to_string_abi_cxx11_
                ((string *)&((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment,
                 (string_view *)&local_78);
      *(undefined8 *)
       ((long)&(((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment).name.field_2 + 8) = 0;
      (((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment).memory_var.loc.filename.data_ =
           (char *)0x0;
      *(undefined2 *)
       &(((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment).memory_var.loc.filename.size_
           = 0;
      RVar6 = ParseLimits(this,(Limits *)
                               ((long)&(((DataSegmentModuleField *)_Var7._M_head_impl)->data_segment
                                       ).name.field_2 + 8));
      if (RVar6.enum_ != Error) {
        local_f8._M_head_impl = (MemoryModuleField *)_Var7._M_head_impl;
        Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                    *)&local_f8);
        if (local_f8._M_head_impl != (MemoryModuleField *)0x0) {
          (*((local_f8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
            super_ModuleField._vptr_ModuleField[1])();
        }
        local_f8._M_head_impl = (MemoryModuleField *)0x0;
        goto LAB_0022ad96;
      }
    }
    pp_Var9 = (((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
               &((DataSegmentModuleField *)_Var7._M_head_impl)->
                super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).
              _vptr_ModuleField;
  }
  (*pp_Var9[1])(_Var7._M_head_impl);
  pMVar3 = local_98.first_;
joined_r0x0022addb:
  while (pMVar3 != (ModuleField *)0x0) {
    pMVar2 = (pMVar3->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*pMVar3->_vptr_ModuleField[1])();
    pMVar3 = pMVar2;
  }
  if ((Import *)local_d8._0_8_ != (Import *)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_);
  }
  return (Result)EVar12;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<MemoryImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else if (MatchLpar(TokenType::Data)) {
    auto data_segment_field = MakeUnique<DataSegmentModuleField>(loc);
    DataSegment& data_segment = data_segment_field->data_segment;
    data_segment.memory_var = Var(module->memories.size());
    data_segment.offset.push_back(MakeUnique<ConstExpr>(Const::I32(0)));
    data_segment.offset.back().loc = loc;
    ParseTextListOpt(&data_segment.data);
    EXPECT(Rpar);

    auto memory_field = MakeUnique<MemoryModuleField>(loc, name);
    uint32_t byte_size = WABT_ALIGN_UP_TO_PAGE(data_segment.data.size());
    uint32_t page_size = WABT_BYTES_TO_PAGES(byte_size);
    memory_field->memory.page_limits.initial = page_size;
    memory_field->memory.page_limits.max = page_size;
    memory_field->memory.page_limits.has_max = true;

    module->AppendField(std::move(memory_field));
    module->AppendField(std::move(data_segment_field));
  } else {
    auto field = MakeUnique<MemoryModuleField>(loc, name);
    CHECK_RESULT(ParseLimits(&field->memory.page_limits));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}